

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O2

int If_CutSopBalanceEvalIntInt
              (Vec_Int_t *vCover,int nLeaves,int *pTimes,Vec_Int_t *vAig,int fCompl,int *pArea)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iRes;
  int pFaninLits [15];
  int local_88;
  uint local_84;
  int *local_80;
  int local_78 [18];
  
  uVar7 = (ulong)(uint)nLeaves;
  local_88 = 0;
  local_84 = fCompl;
  local_80 = pTimes;
  if (vAig != (Vec_Int_t *)0x0) {
    uVar6 = 0;
    uVar8 = 0;
    if (0 < nLeaves) {
      uVar8 = (ulong)(uint)nLeaves;
    }
    for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      iVar1 = Abc_Var2Lit((int)uVar6,(int)uVar7);
      local_78[uVar6] = iVar1;
    }
  }
  iVar2 = If_CutSopBalanceEvalInt(vCover,local_80,local_78,vAig,&local_88,nLeaves,pArea);
  iVar1 = local_88;
  if (iVar2 != -1 && vAig != (Vec_Int_t *)0x0) {
    iVar3 = Abc_Lit2Var(local_88);
    iVar4 = Abc_Lit2Var(vAig->nSize);
    if (iVar3 != iVar4 + nLeaves + -1) {
      __assert_fail("vAig == NULL || Abc_Lit2Var(iRes) == nLeaves + Abc_Lit2Var(Vec_IntSize(vAig)) - 1"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                    ,0xf2,
                    "int If_CutSopBalanceEvalIntInt(Vec_Int_t *, int, int *, Vec_Int_t *, int, int *)"
                   );
    }
    uVar5 = Abc_LitIsCompl(iVar1);
    Vec_IntPush(vAig,local_84 ^ uVar5);
    if ((vAig->nSize & 1) == 0) {
      __assert_fail("vAig == NULL || (Vec_IntSize(vAig) & 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                    ,0xf5,
                    "int If_CutSopBalanceEvalIntInt(Vec_Int_t *, int, int *, Vec_Int_t *, int, int *)"
                   );
    }
  }
  return iVar2;
}

Assistant:

int If_CutSopBalanceEvalIntInt( Vec_Int_t * vCover, int nLeaves, int * pTimes, Vec_Int_t * vAig, int fCompl, int * pArea ) 
{
    int pFaninLits[IF_MAX_FUNC_LUTSIZE];
    int iRes = 0, Res, k;
    if ( vAig )
        for ( k = 0; k < nLeaves; k++ )
            pFaninLits[k] = Abc_Var2Lit(k, 0);
    Res = If_CutSopBalanceEvalInt( vCover, pTimes, pFaninLits, vAig, &iRes, nLeaves, pArea );
    if ( Res == -1 )
        return -1;
    assert( vAig == NULL || Abc_Lit2Var(iRes) == nLeaves + Abc_Lit2Var(Vec_IntSize(vAig)) - 1 );
    if ( vAig )
        Vec_IntPush( vAig, Abc_LitIsCompl(iRes) ^ fCompl );
    assert( vAig == NULL || (Vec_IntSize(vAig) & 1) );
    return Res;
}